

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateCompoundVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,int expandLevel)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  TestNode *node;
  deInt32 *pdVar3;
  SharedPtr structMember;
  SharedPtr local_48;
  
  if (0 < expandLevel) {
    pNVar1 = (Node *)operator_new(0x20);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar1->m_type = TYPE_STRUCT_MEMBER;
    (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar2 = parentStructure->m_state;
    (pNVar1->m_enclosingNode).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar3 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar3 = *pdVar3 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    local_48.m_state = (SharedPtrStateBase *)0x0;
    local_48.m_ptr = pNVar1;
    pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar2->strongRefCount = 0;
    pSVar2->weakRefCount = 0;
    pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar2->strongRefCount = 1;
    pSVar2->weakRefCount = 1;
    local_48.m_state = pSVar2;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,"struct","Structs");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    generateVariableCases
              (context,&local_48,(TestCaseGroup *)node,queryTarget,expandLevel,expandLevel != 1);
    generateOpaqueTypeCases
              (context,&local_48,(TestCaseGroup *)node,queryTarget,expandLevel,expandLevel != 1);
    generateVariableArrayCases(context,&local_48,(TestCaseGroup *)node,queryTarget,expandLevel + -1)
    ;
    generateCompoundVariableCases
              (context,&local_48,(TestCaseGroup *)node,queryTarget,expandLevel + -1);
    pdVar3 = &pSVar2->strongRefCount;
    LOCK();
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      local_48.m_ptr = (Node *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar3 = &(local_48.m_state)->weakRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if ((*pdVar3 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateCompoundVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, int expandLevel)
{
	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		tcu::TestCaseGroup* const					blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), "struct", "Structs");

		targetGroup->addChild(blockGroup);

		// Struct containing basic variable
		generateVariableCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing opaque types
		generateOpaqueTypeCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing arrays
		generateVariableArrayCases(context, structMember, blockGroup, queryTarget, expandLevel-1);

		// Struct containing struct
		generateCompoundVariableCases(context, structMember, blockGroup, queryTarget, expandLevel-1);
	}
}